

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Redim
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t newDim,int64_t param_2)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  complex<double> *local_20;
  
  iVar2 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  pp_Var1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable;
  if (CONCAT44(extraout_var,iVar2) == newDim) {
    (*pp_Var1[0xf])(this);
  }
  else {
    (*pp_Var1[0x4e])(this);
    TPZVec<std::complex<double>_*>::Resize(&this->fElem,newDim);
    local_20 = (complex<double> *)0x0;
    TPZVec<std::complex<double>_*>::Fill(&this->fElem,&local_20,0,-1);
    (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = newDim;
    (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = newDim;
    (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Redim( int64_t newDim , int64_t)
{
	if ( newDim == this->Dim() )
    {
		Zero();
		return( 1 );
    }
	
	Clear();
	fElem.Resize(newDim);
	fElem.Fill(0);
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}